

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  AbstractTxIn *pAVar5;
  CfdException *this_00;
  bool bVar6;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  Txid local_48;
  ulong local_28;
  size_t i;
  Txid *pTStack_18;
  uint32_t vout_local;
  Txid *txid_local;
  Transaction *this_local;
  
  local_28 = 0;
  i._4_4_ = vout;
  pTStack_18 = txid;
  txid_local = (Txid *)this;
  while( true ) {
    uVar1 = local_28;
    sVar4 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
    if (sVar4 <= uVar1) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x201;
      local_70.funcname = "GetTxInIndex";
      logger::warn<>(&local_70,"Txid is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"Txid is not found.",&local_91);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_90);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pAVar5 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                        (&this->vin_,local_28)->super_AbstractTxIn;
    AbstractTxIn::GetTxid(&local_48,pAVar5);
    bVar2 = Txid::Equals(&local_48,pTStack_18);
    bVar6 = false;
    if (bVar2) {
      pAVar5 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                          (&this->vin_,local_28)->super_AbstractTxIn;
      uVar3 = AbstractTxIn::GetVout(pAVar5);
      bVar6 = uVar3 == i._4_4_;
    }
    Txid::~Txid(&local_48);
    if (bVar6) break;
    local_28 = local_28 + 1;
  }
  return (uint32_t)local_28;
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}